

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_THash,_TEq,_phmap::priv::Alloc<long>_>::
resize(raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_THash,_TEq,_phmap::priv::Alloc<long>_>
       *this,size_t new_capacity)

{
  size_t hashval;
  ctrl_t *p;
  slot_type *psVar1;
  size_t capacity;
  undefined1 auVar2 [16];
  ctrl_t *__s;
  size_t sVar3;
  ulong uVar4;
  Layout LVar5;
  FindInfo FVar6;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("IsValidCapacity(new_capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x807,
                  "void phmap::priv::raw_hash_set<phmap::priv::(anonymous namespace)::IntPolicy, THash, TEq, phmap::priv::Alloc<long>>::resize(size_t) [Policy = phmap::priv::(anonymous namespace)::IntPolicy, Hash = THash, Eq = TEq, Alloc = phmap::priv::Alloc<long>]"
                 );
  }
  p = this->ctrl_;
  psVar1 = this->slots_;
  capacity = this->capacity_;
  LVar5 = MakeLayout(new_capacity);
  uVar4 = LVar5.super_LayoutType<sizeof___(Ts),_signed_char,_long>.size_[0] + 7 & 0xfffffffffffffff8
  ;
  __s = (ctrl_t *)
        Allocate<8ul,phmap::priv::Alloc<long>>
                  ((Alloc<long> *)&this->settings_,
                   LVar5.super_LayoutType<sizeof___(Ts),_signed_char,_long>.size_[1] * 8 + uVar4);
  if (((ulong)__s & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0xf84,
                  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<signed char, long>, phmap::integer_sequence<unsigned long, 0, 1>, phmap::integer_sequence<unsigned long, 0, 1>>::Pointer(Char *) const [Elements = std::tuple<signed char, long>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1>, N = 0UL, Char = char]"
                 );
  }
  this->ctrl_ = __s;
  this->slots_ = (slot_type *)(__s + uVar4);
  memset(__s,0x80,new_capacity + 0x10);
  this->ctrl_[new_capacity] = -1;
  reset_growth_left(this,new_capacity);
  this->capacity_ = new_capacity;
  if (capacity != 0) {
    sVar3 = 0;
    do {
      if (-1 < p[sVar3]) {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = psVar1[sVar3];
        hashval = SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar2,8) +
                  SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar2,0);
        FVar6 = find_first_non_full(this,hashval);
        set_ctrl(this,FVar6.offset,(byte)hashval & 0x7f);
        this->slots_[FVar6.offset] = psVar1[sVar3];
      }
      sVar3 = sVar3 + 1;
    } while (capacity != sVar3);
    LVar5 = MakeLayout(capacity);
    Deallocate<8ul,phmap::priv::Alloc<long>>
              ((Alloc<long> *)&this->settings_,p,
               (LVar5.super_LayoutType<sizeof___(Ts),_signed_char,_long>.size_[0] + 7 &
               0xfffffffffffffff8) +
               LVar5.super_LayoutType<sizeof___(Ts),_signed_char,_long>.size_[1] * 8);
    return;
  }
  return;
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }